

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

int bpmnode_compare(void *a,void *b)

{
  int wb;
  int wa;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  if (*a < *b) {
    local_4 = -1;
  }
  else if (*b < *a) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
    if (*(uint *)((long)a + 4) < *(uint *)((long)b + 4)) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int bpmnode_compare(const void* a, const void* b)
{
  int wa = ((const BPMNode*)a)->weight;
  int wb = ((const BPMNode*)b)->weight;
  if(wa < wb) return -1;
  if(wa > wb) return 1;
  /*make the qsort a stable sort*/
  return ((const BPMNode*)a)->index < ((const BPMNode*)b)->index ? 1 : -1;
}